

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O2

void __thiscall ChatWindow::userLeft(ChatWindow *this,QString *username)

{
  QStandardItemModel *pQVar1;
  undefined4 uVar2;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_70 [24];
  QArrayDataPointer<char16_t> local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_a8 = 0xffffffffffffffff;
  local_a0 = 0;
  uStack_98 = 0;
  uVar2 = (**(code **)(*(long *)this->m_chatModel + 0x78))(this->m_chatModel,&local_a8);
  local_a8 = 0xffffffffffffffff;
  local_a0 = 0;
  uStack_98 = 0;
  (**(code **)(*(long *)this->m_chatModel + 0xf8))(this->m_chatModel,uVar2,1,&local_a8);
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,uVar2,0);
  tr((QString *)&local_58,"%1 Left the Chat",(char *)0x0,-1);
  QString::arg((QString *)&local_88,(int)&local_58,(QChar)(char16_t)username);
  QVariant::QVariant((QVariant *)&local_a8,(QString *)&local_88);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,2);
  QVariant::~QVariant((QVariant *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,uVar2,0);
  QVariant::QVariant((QVariant *)&local_a8,0x84);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,7);
  QVariant::~QVariant((QVariant *)&local_a8);
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,uVar2,0);
  QBrush::QBrush((QBrush *)&local_88,7,1);
  QBrush::operator_cast_to_QVariant((QBrush *)&local_a8);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,9);
  QVariant::~QVariant((QVariant *)&local_a8);
  QBrush::~QBrush((QBrush *)&local_88);
  QAbstractItemView::scrollToBottom();
  QString::clear(&this->m_lastUserName);
  return;
}

Assistant:

void ChatWindow::userLeft(const QString &username)
{
    // store the index of the new row to append to the model containing the messages
    const int newRow = m_chatModel->rowCount();
    // insert a row
    m_chatModel->insertRow(newRow);
    // store in the model the message to comunicate a user left
    m_chatModel->setData(m_chatModel->index(newRow, 0), tr("%1 Left the Chat").arg(username));
    // set the alignment for the text
    m_chatModel->setData(m_chatModel->index(newRow, 0), Qt::AlignCenter, Qt::TextAlignmentRole);
    // set the color for the text
    m_chatModel->setData(m_chatModel->index(newRow, 0), QBrush(Qt::red), Qt::ForegroundRole);
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
    // reset the last printed username
    m_lastUserName.clear();
}